

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall bloaty::Bloaty::ScanAndRollup(Bloaty *this,Options *options,RollupOutput *output)

{
  string_view from;
  string_view from_00;
  string_view from_01;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view name_00;
  bool bVar1;
  Rollup *in_RDX;
  RollupOutput *in_RDI;
  undefined1 auVar2 [16];
  InputFileInfo *file_info_3;
  iterator __end2_3;
  iterator __begin2_3;
  vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_> *__range2_3;
  InputFileInfo *file_info_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_> *__range2_2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair;
  iterator __end2_1;
  iterator __begin2_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2_1;
  string unused_debug;
  string input_files;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *build_id;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  InputFileInfo *file_info_1;
  iterator __end2;
  iterator __begin2;
  vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_> *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  base_filenames;
  Rollup base;
  InputFileInfo *file_info;
  iterator __end1_1;
  iterator __begin1_1;
  vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_> *__range1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  input_filenames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  build_ids;
  Rollup rollup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  Options *in_stack_fffffffffffffab8;
  Rollup *in_stack_fffffffffffffac0;
  int line;
  Options *in_stack_fffffffffffffad0;
  Rollup *in_stack_fffffffffffffad8;
  Rollup *in_stack_fffffffffffffae0;
  Arg *in_stack_fffffffffffffaf0;
  Arg *in_stack_fffffffffffffaf8;
  RollupOutput *in_stack_fffffffffffffb00;
  Rollup *in_stack_fffffffffffffb08;
  Rollup *in_stack_fffffffffffffb10;
  string local_460 [96];
  string local_400 [32];
  reference local_3e0;
  InputFileInfo *local_3d8;
  __normal_iterator<bloaty::Bloaty::InputFileInfo_*,_std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>_>
  local_3d0;
  pointer *local_3c8;
  Rollup *in_stack_fffffffffffffc68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc78;
  Bloaty *in_stack_fffffffffffffc80;
  string local_320 [32];
  reference local_300;
  InputFileInfo *local_2f8;
  __normal_iterator<bloaty::Bloaty::InputFileInfo_*,_std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>_>
  local_2f0;
  int64_t *local_2e8;
  undefined1 local_2b0 [16];
  string local_2a0 [96];
  string local_240 [32];
  reference local_220;
  _Self local_218;
  _Self local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_208;
  string local_200 [32];
  string local_1e0 [32];
  reference local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b0;
  undefined1 *local_1a8;
  reference local_1a0;
  InputFileInfo *local_198;
  __normal_iterator<bloaty::Bloaty::InputFileInfo_*,_std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>_>
  local_190;
  pointer *local_188;
  reference local_f8;
  InputFileInfo *local_f0;
  __normal_iterator<bloaty::Bloaty::InputFileInfo_*,_std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>_>
  local_e8;
  int64_t *local_e0;
  undefined1 local_c0 [120];
  undefined1 local_48 [16];
  reference local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  double *local_20;
  Rollup *local_18;
  
  local_18 = in_RDX;
  bVar1 = std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
          ::empty((vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
                   *)in_stack_fffffffffffffad0);
  if (bVar1) {
    Throw((char *)in_stack_fffffffffffffad0,(int)((ulong)in_RDI >> 0x20));
  }
  local_20 = &in_RDI[1].toplevel_row_.vmpercent;
  local_28._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffab8);
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffab8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffac0,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffab8);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_28);
    in_stack_fffffffffffffac0 = local_18;
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
    name_00._M_str = (char *)in_stack_fffffffffffffb10;
    name_00._M_len = (size_t)in_stack_fffffffffffffb08;
    local_48 = auVar2;
    RollupOutput::AddDataSourceName(in_stack_fffffffffffffb00,name_00);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_28);
  }
  Rollup::Rollup((Rollup *)0x19643f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x19644c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x196459);
  local_e0 = &in_RDI[1].toplevel_row_.old_size.file;
  local_e8._M_current =
       (InputFileInfo *)
       std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>::
       begin((vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
              *)in_stack_fffffffffffffab8);
  local_f0 = (InputFileInfo *)
             std::
             vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>::
             end((vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
                  *)in_stack_fffffffffffffab8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<bloaty::Bloaty::InputFileInfo_*,_std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>_>
                        *)in_stack_fffffffffffffac0,
                       (__normal_iterator<bloaty::Bloaty::InputFileInfo_*,_std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>_>
                        *)in_stack_fffffffffffffab8);
    if (!bVar1) break;
    local_f8 = __gnu_cxx::
               __normal_iterator<bloaty::Bloaty::InputFileInfo_*,_std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>_>
               ::operator*(&local_e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffad0,(value_type *)in_RDI);
    __gnu_cxx::
    __normal_iterator<bloaty::Bloaty::InputFileInfo_*,_std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>_>
    ::operator++(&local_e8);
  }
  ScanAndRollupFiles(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                     in_stack_fffffffffffffc68);
  bVar1 = std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
          ::empty((vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
                   *)in_stack_fffffffffffffad0);
  if (bVar1) {
    Rollup::CreateRollupOutput
              (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,(RollupOutput *)0x1966c3);
  }
  else {
    Rollup::Rollup((Rollup *)0x196551);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x196560);
    local_188 = &in_RDI[1].toplevel_row_.sorted_children.
                 super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    local_190._M_current =
         (InputFileInfo *)
         std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
         ::begin((vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
                  *)in_stack_fffffffffffffab8);
    local_198 = (InputFileInfo *)
                std::
                vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
                ::end((vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
                       *)in_stack_fffffffffffffab8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<bloaty::Bloaty::InputFileInfo_*,_std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>_>
                          *)in_stack_fffffffffffffac0,
                         (__normal_iterator<bloaty::Bloaty::InputFileInfo_*,_std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>_>
                          *)in_stack_fffffffffffffab8);
      if (!bVar1) break;
      local_1a0 = __gnu_cxx::
                  __normal_iterator<bloaty::Bloaty::InputFileInfo_*,_std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>_>
                  ::operator*(&local_190);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffad0,(value_type *)in_RDI);
      __gnu_cxx::
      __normal_iterator<bloaty::Bloaty::InputFileInfo_*,_std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>_>
      ::operator++(&local_190);
    }
    ScanAndRollupFiles(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70
                       ,in_stack_fffffffffffffc68);
    Rollup::AddEntriesFrom(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    Rollup::CreateDiffModeRollupOutput
              (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,in_RDI)
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffad0);
    Rollup::~Rollup((Rollup *)0x1966a4);
  }
  local_1a8 = local_c0;
  local_1b0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffab8);
  local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffab8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffac0,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffab8);
    if (!bVar1) break;
    local_1c0 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_1b0);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::erase((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)in_stack_fffffffffffffac0,(key_type *)in_stack_fffffffffffffab8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_1b0);
  }
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x19676e);
  if (!bVar1) {
    std::__cxx11::string::string(local_1e0);
    std::__cxx11::string::string(local_200);
    local_208 = &in_RDI[1].disassembly_.field_2;
    local_210._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffab8);
    local_218._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffab8);
    while( true ) {
      bVar1 = std::operator!=(&local_210,&local_218);
      if (!bVar1) break;
      local_220 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)0x1967f8);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffad0,
                 (char *)in_RDI);
      auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_220);
      from._M_str = (char *)in_stack_fffffffffffffaf8;
      from._M_len = (size_t)in_stack_fffffffffffffaf0;
      local_2b0 = auVar2;
      absl::BytesToHexString_abi_cxx11_(from);
      std::__cxx11::string::c_str();
      absl::substitute_internal::Arg::Arg
                ((Arg *)in_stack_fffffffffffffac0,(Nullable<const_char_*>)in_stack_fffffffffffffab8)
      ;
      std::__cxx11::string::c_str();
      absl::substitute_internal::Arg::Arg
                ((Arg *)in_stack_fffffffffffffac0,(Nullable<const_char_*>)in_stack_fffffffffffffab8)
      ;
      format._M_str = (char *)in_stack_fffffffffffffb08;
      format._M_len = (size_t)in_stack_fffffffffffffb00;
      absl::Substitute_abi_cxx11_(format,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
      std::__cxx11::string::operator+=(local_200,local_240);
      std::__cxx11::string::~string(local_240);
      std::__cxx11::string::~string(local_2a0);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffac0);
    }
    local_2e8 = &in_RDI[1].toplevel_row_.old_size.file;
    local_2f0._M_current =
         (InputFileInfo *)
         std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
         ::begin((vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
                  *)in_stack_fffffffffffffab8);
    local_2f8 = (InputFileInfo *)
                std::
                vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
                ::end((vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
                       *)in_stack_fffffffffffffab8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<bloaty::Bloaty::InputFileInfo_*,_std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>_>
                          *)in_stack_fffffffffffffac0,
                         (__normal_iterator<bloaty::Bloaty::InputFileInfo_*,_std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>_>
                          *)in_stack_fffffffffffffab8);
      if (!bVar1) break;
      local_300 = __gnu_cxx::
                  __normal_iterator<bloaty::Bloaty::InputFileInfo_*,_std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>_>
                  ::operator*(&local_2f0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffad0,
                 (char *)in_RDI);
      std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_300->build_id_);
      from_00._M_str = (char *)in_stack_fffffffffffffaf8;
      from_00._M_len = (size_t)in_stack_fffffffffffffaf0;
      absl::BytesToHexString_abi_cxx11_(from_00);
      std::__cxx11::string::c_str();
      absl::substitute_internal::Arg::Arg
                ((Arg *)in_stack_fffffffffffffac0,(Nullable<const_char_*>)in_stack_fffffffffffffab8)
      ;
      std::__cxx11::string::c_str();
      absl::substitute_internal::Arg::Arg
                ((Arg *)in_stack_fffffffffffffac0,(Nullable<const_char_*>)in_stack_fffffffffffffab8)
      ;
      format_00._M_str = (char *)in_stack_fffffffffffffb08;
      format_00._M_len = (size_t)in_stack_fffffffffffffb00;
      absl::Substitute_abi_cxx11_(format_00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
      std::__cxx11::string::operator+=(local_1e0,local_320);
      std::__cxx11::string::~string(local_320);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffc80);
      __gnu_cxx::
      __normal_iterator<bloaty::Bloaty::InputFileInfo_*,_std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>_>
      ::operator++(&local_2f0);
    }
    local_3c8 = &in_RDI[1].toplevel_row_.sorted_children.
                 super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    local_3d0._M_current =
         (InputFileInfo *)
         std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
         ::begin((vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
                  *)in_stack_fffffffffffffab8);
    local_3d8 = (InputFileInfo *)
                std::
                vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
                ::end((vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
                       *)in_stack_fffffffffffffab8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<bloaty::Bloaty::InputFileInfo_*,_std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>_>
                          *)in_stack_fffffffffffffac0,
                         (__normal_iterator<bloaty::Bloaty::InputFileInfo_*,_std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>_>
                          *)in_stack_fffffffffffffab8);
      if (!bVar1) break;
      local_3e0 = __gnu_cxx::
                  __normal_iterator<bloaty::Bloaty::InputFileInfo_*,_std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>_>
                  ::operator*(&local_3d0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffad0,
                 (char *)in_RDI);
      std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_3e0->build_id_);
      from_01._M_str = (char *)in_stack_fffffffffffffaf8;
      from_01._M_len = (size_t)in_stack_fffffffffffffaf0;
      absl::BytesToHexString_abi_cxx11_(from_01);
      std::__cxx11::string::c_str();
      absl::substitute_internal::Arg::Arg
                ((Arg *)in_stack_fffffffffffffac0,(Nullable<const_char_*>)in_stack_fffffffffffffab8)
      ;
      std::__cxx11::string::c_str();
      absl::substitute_internal::Arg::Arg
                ((Arg *)in_stack_fffffffffffffac0,(Nullable<const_char_*>)in_stack_fffffffffffffab8)
      ;
      format_01._M_str = (char *)in_stack_fffffffffffffb08;
      format_01._M_len = (size_t)in_stack_fffffffffffffb00;
      absl::Substitute_abi_cxx11_(format_01,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
      std::__cxx11::string::operator+=(local_1e0,local_400);
      std::__cxx11::string::~string(local_400);
      std::__cxx11::string::~string(local_460);
      __gnu_cxx::
      __normal_iterator<bloaty::Bloaty::InputFileInfo_*,_std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>_>
      ::operator++(&local_3d0);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffad0,
               (char *)in_RDI);
    line = (int)((ulong)in_RDI >> 0x20);
    std::__cxx11::string::c_str();
    absl::substitute_internal::Arg::Arg
              ((Arg *)in_stack_fffffffffffffac0,(Nullable<const_char_*>)in_stack_fffffffffffffab8);
    std::__cxx11::string::c_str();
    absl::substitute_internal::Arg::Arg
              ((Arg *)in_stack_fffffffffffffac0,(Nullable<const_char_*>)in_stack_fffffffffffffab8);
    format_02._M_str = (char *)in_stack_fffffffffffffb08;
    format_02._M_len = (size_t)in_stack_fffffffffffffb00;
    absl::Substitute_abi_cxx11_(format_02,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
    std::__cxx11::string::c_str();
    Throw((char *)in_stack_fffffffffffffad0,line);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffad0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffad0);
  Rollup::~Rollup((Rollup *)0x196dcf);
  return;
}

Assistant:

void Bloaty::ScanAndRollup(const Options& options, RollupOutput* output) {
  if (input_files_.empty()) {
    THROW("no filename specified");
  }

  for (const auto& name : source_names_) {
    output->AddDataSourceName(name);
  }

  Rollup rollup;
  std::vector<std::string> build_ids;
  std::vector<std::string> input_filenames;
  for (const auto& file_info : input_files_) {
    input_filenames.push_back(file_info.filename_);
  }
  ScanAndRollupFiles(input_filenames, &build_ids, &rollup);

  if (!base_files_.empty()) {
    Rollup base;
    std::vector<std::string> base_filenames;
    for (const auto& file_info : base_files_) {
      base_filenames.push_back(file_info.filename_);
    }
    ScanAndRollupFiles(base_filenames, &build_ids, &base);
    rollup.AddEntriesFrom(base);
    rollup.CreateDiffModeRollupOutput(&base, options, output);
  } else {
    rollup.CreateRollupOutput(options, output);
  }

  for (const auto& build_id : build_ids) {
    debug_files_.erase(build_id);
  }

  // Error out if some --debug-files were not used.
  if (!debug_files_.empty()) {
    std::string input_files;
    std::string unused_debug;
    for (const auto& pair : debug_files_) {
      unused_debug += absl::Substitute(
          "$0   $1\n", absl::BytesToHexString(pair.first).c_str(),
          pair.second.c_str());
    }

    for (const auto& file_info : input_files_) {
      input_files += absl::Substitute(
          "$0   $1\n", absl::BytesToHexString(file_info.build_id_).c_str(),
          file_info.filename_.c_str());
    }
    for (const auto& file_info : base_files_) {
      input_files += absl::Substitute(
          "$0   $1\n", absl::BytesToHexString(file_info.build_id_).c_str(),
          file_info.filename_.c_str());
    }
    THROWF("Debug file(s) did not match any input file:\n$0\nInput Files:\n$1",
           unused_debug.c_str(), input_files.c_str());
  }
}